

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::TestClearColor<unsigned_int>
          (ClearTest *this,GLenum buffer,GLenum attachment,uint value)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  GLenum GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  uint local_34;
  long lStack_30;
  uint pixel;
  Functions *gl;
  GLenum local_20;
  uint value_local;
  GLenum attachment_local;
  GLenum buffer_local;
  ClearTest *this_local;
  
  gl._4_4_ = value;
  local_20 = attachment;
  value_local = buffer;
  _attachment_local = this;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lStack_30 + 0x558))(local_20);
  dVar4 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar4,"glDrawBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x923);
  bVar2 = ClearColor<unsigned_int>(this,value_local,0,gl._4_4_);
  if (bVar2) {
    local_34 = 0;
    (**(code **)(lStack_30 + 0x1218))(local_20);
    dVar4 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar4,"glReadBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x92c);
    pcVar1 = *(code **)(lStack_30 + 0x1220);
    GVar5 = Format<unsigned_int>(this);
    GVar6 = Type<unsigned_int>(this);
    (*pcVar1)(0,0,1,1,GVar5,GVar6,&local_34);
    dVar4 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar4,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x92f);
    bVar2 = Compare<unsigned_int>(this,local_34,gl._4_4_);
    if (bVar2) {
      return true;
    }
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [56])"ClearNamedFramebuffer did not cleared color attachment ");
    EVar9 = glu::getFramebufferAttachmentStr(local_20);
    local_1d8[0].m_getName = EVar9.m_getName;
    local_1d8[0].m_value = EVar9.m_value;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1d8);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2a795e3);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return false;
}

Assistant:

bool ClearTest::TestClearColor(glw::GLenum buffer, glw::GLenum attachment, T value)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.drawBuffer(attachment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

	/* Clear. */
	if (ClearColor<T>(buffer, 0, value))
	{
		/* Fetching framebuffer content. */
		T pixel = (T)0;

		gl.readBuffer(attachment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");

		gl.readPixels(0, 0, 1, 1, Format<T>(), Type<T>(), &pixel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

		/* Comparison with reference value. */
		if (Compare(pixel, value))
		{
			return true;
		}

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebuffer did not cleared color attachment "
			<< glu::getFramebufferAttachmentStr(attachment) << " of the framebuffer." << tcu::TestLog::EndMessage;
	}

	return false;
}